

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Image image;
  undefined1 local_130 [96];
  Image local_d0;
  Image local_70;
  
  local_130._0_8_ = local_130 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"../img/fist.jpg","");
  Image::Image(&local_70,(string *)local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  Image::sobel(&local_d0,&local_70);
  Image::GNG((Image *)local_130,&local_d0);
  Image::displayImage((Image *)local_130);
  cv::Mat::~Mat((Mat *)local_130);
  cv::Mat::~Mat(&local_d0.content);
  cv::Mat::~Mat(&local_70.content);
  return 0;
}

Assistant:

int main() {
    Image image("../img/fist.jpg");

    // Image edges(image.canny().getBinaryMatrix());

    // Image gng = image.canny().GNG();
    // image.sobel().displayImage();
    image.sobel().GNG().displayImage();
    return 0;
}